

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall Fossilize::StateReplayer::StateReplayer(StateReplayer *this)

{
  Impl *pIVar1;
  Impl *pIVar2;
  
  pIVar1 = (Impl *)operator_new(0x1d0);
  pIVar2 = (Impl *)operator_new(0x20);
  (pIVar2->blocks).
  super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar2->blocks).
  super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar2->blocks).
  super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2->peak_history_size = 0;
  (pIVar1->allocator).impl = pIVar2;
  (pIVar1->replayed_samplers)._M_h._M_buckets = &(pIVar1->replayed_samplers)._M_h._M_single_bucket;
  (pIVar1->replayed_samplers)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_samplers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_samplers)._M_h._M_element_count = 0;
  (pIVar1->replayed_samplers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_samplers)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_samplers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_buckets =
       &(pIVar1->replayed_descriptor_set_layouts)._M_h._M_single_bucket;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_element_count = 0;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_descriptor_set_layouts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_buckets =
       &(pIVar1->replayed_pipeline_layouts)._M_h._M_single_bucket;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_element_count = 0;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_pipeline_layouts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_shader_modules)._M_h._M_buckets =
       &(pIVar1->replayed_shader_modules)._M_h._M_single_bucket;
  (pIVar1->replayed_shader_modules)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_shader_modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_shader_modules)._M_h._M_element_count = 0;
  (pIVar1->replayed_shader_modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_shader_modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_shader_modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_render_passes)._M_h._M_buckets =
       &(pIVar1->replayed_render_passes)._M_h._M_single_bucket;
  (pIVar1->replayed_render_passes)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_render_passes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_render_passes)._M_h._M_element_count = 0;
  (pIVar1->replayed_render_passes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_render_passes)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_render_passes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_compute_pipelines)._M_h._M_buckets =
       &(pIVar1->replayed_compute_pipelines)._M_h._M_single_bucket;
  (pIVar1->replayed_compute_pipelines)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_compute_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_compute_pipelines)._M_h._M_element_count = 0;
  (pIVar1->replayed_compute_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_compute_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_compute_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_buckets =
       &(pIVar1->replayed_graphics_pipelines)._M_h._M_single_bucket;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_element_count = 0;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_graphics_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_buckets =
       &(pIVar1->replayed_raytracing_pipelines)._M_h._M_single_bucket;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_bucket_count = 1;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_element_count = 0;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->replayed_raytracing_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar1->resolve_derivative_pipelines = true;
  pIVar1->resolve_shader_modules = true;
  this->impl = pIVar1;
  return;
}

Assistant:

StateReplayer::StateReplayer()
{
	impl = new Impl;
}